

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileTree.cpp
# Opt level: O2

PCASC_FILE_NODE __thiscall
CASC_FILE_TREE::Insert
          (CASC_FILE_TREE *this,PCONTENT_KEY pCKey,char *szFullPath,DWORD DataId,DWORD FileSize,
          DWORD LocaleId)

{
  char *szNodeEnd;
  byte bVar1;
  size_t sVar2;
  char *szNodeBegin;
  size_t nLength;
  PCASC_FILE_NODE local_458;
  char szNormPath [1025];
  
  local_458 = (PCASC_FILE_NODE)0x0;
  sVar2 = 0;
  nLength = 0;
  szNodeBegin = szFullPath;
  do {
    szNodeEnd = szFullPath + nLength;
    bVar1 = szFullPath[nLength];
    if ((long)(char)bVar1 == 0) {
      if (szNodeBegin < szNodeEnd) {
        local_458 = GetOrInsert(this,szNormPath,nLength,szNodeBegin,szNodeEnd,pCKey,(DWORD)sVar2,
                                DataId);
        if (local_458 == (PCASC_FILE_NODE)0x0) {
          local_458 = (PCASC_FILE_NODE)0x0;
        }
        else {
          if (this->FileSizeOffset != 0) {
            *(DWORD *)((local_458->CKey).Value + this->FileSizeOffset) = FileSize;
          }
          if (this->LocaleIdOffset != 0) {
            *(DWORD *)((local_458->CKey).Value + this->LocaleIdOffset) = LocaleId;
          }
        }
      }
      return local_458;
    }
    if ((bVar1 - 0x2f < 0x2e) && ((0x200000000801U >> ((ulong)(bVar1 - 0x2f) & 0x3f) & 1) != 0)) {
      local_458 = GetOrInsert(this,szNormPath,nLength,szNodeBegin,szNodeEnd,(PCONTENT_KEY)0x0,
                              (DWORD)sVar2,0xffffffff);
      if (local_458 == (PCASC_FILE_NODE)0x0) {
        return (PCASC_FILE_NODE)0x0;
      }
      local_458->Flags = (ushort)(bVar1 == 0x3a) * 2 | local_458->Flags | 1;
      sVar2 = CASC_ARRAY::IndexOf(&this->FileTable,local_458);
      szNodeBegin = szFullPath + nLength + 1;
    }
    szNormPath[nLength] = AsciiToUpperTable_BkSlash[(char)bVar1];
    nLength = nLength + 1;
  } while( true );
}

Assistant:

PCASC_FILE_NODE CASC_FILE_TREE::Insert(PCONTENT_KEY pCKey, const char * szFullPath, DWORD DataId, DWORD FileSize, DWORD LocaleId)
{
    PCASC_FILE_NODE pFileNode = NULL;
    const char * szNodeBegin = szFullPath;
    char szNormPath[MAX_PATH+1];
    DWORD Parent = 0;
    size_t i;

    // Traverse the entire path and make sure that all subdirs are there
    for(i = 0; szFullPath[i] != 0; i++)
    {
        char chOneChar = szFullPath[i];

        // Is there a path separator?
        // Note: Warcraft III paths may contain "mount points".
        // Example: "frFR-War3Local.mpq:Maps/FrozenThrone/Campaign/NightElfX06Interlude.w3x:war3map.j"
        if(chOneChar == '\\' || chOneChar == '/' || chOneChar == ':')
        {
            pFileNode = GetOrInsert(szNormPath, i, szNodeBegin, szFullPath + i, NULL, Parent, CASC_INVALID_ID);
            if(pFileNode == NULL)
                return NULL;

            // Supply the missing values
            pFileNode->Flags |= (chOneChar == ':') ? CFN_FLAG_MOUNT_POINT : 0;
            pFileNode->Flags |= CFN_FLAG_FOLDER;

            // Get the new parent item
            Parent = (DWORD)FileTable.IndexOf(pFileNode);

            // Also reset the begin of the node
            szNodeBegin = szFullPath + i + 1;
        }

        // Copy the next character, even if it was slash/backslash before
        szNormPath[i] = AsciiToUpperTable_BkSlash[chOneChar];
    }

    // If there is anything left, we insert it as file name
    if((szFullPath + i) > szNodeBegin)
    {
        pFileNode = GetOrInsert(szNormPath, i, szNodeBegin, szFullPath + i, pCKey, Parent, DataId);
        if(pFileNode != NULL)
        {
            SetExtras(pFileNode, FileSize, LocaleId);
        }
    }

    // Return the file node
    return pFileNode;
}